

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_scroll.cpp
# Opt level: O3

void P_SpawnScrollers(void)

{
  uint uVar1;
  int iVar2;
  side_t *psVar3;
  side_t *psVar4;
  EScrollPos EVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  uint uVar8;
  bool bVar9;
  uint uVar10;
  int iVar11;
  FLineSpecial *pFVar12;
  DScroller *pDVar13;
  line_t_conflict *plVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  line_t_conflict *plVar20;
  double dVar21;
  FSectorTagIterator itr;
  TArray<int,_int> copyscrollers;
  uint local_84;
  FLineIdIterator local_80;
  TArray<int,_int> local_78;
  undefined8 local_68;
  double dStack_60;
  undefined4 local_58;
  uint uStack_54;
  undefined4 uStack_50;
  uint uStack_4c;
  double local_48;
  double dStack_40;
  
  plVar20 = lines;
  dVar21 = (double)CONCAT44(local_68._4_4_,(int)local_68);
  local_78.Array = (int *)0x0;
  local_78.Most = 0;
  local_78.Count = 0;
  if (0 < numlines) {
    lVar18 = 0x28;
    lVar16 = 0;
    plVar14 = lines;
    iVar15 = numlines;
    do {
      if (*(int *)((long)plVar14->args + lVar18 + -0x2c) == 0x3a) {
        bVar9 = FTagManager::SectorHasTag
                          (&tagManager,*(sector_t **)((long)plVar14->sidedef + lVar18 + 8),
                           *(int *)((long)plVar14->args + lVar18 + -0x28));
        if (!bVar9) {
          TArray<int,_int>::Grow(&local_78,1);
          local_78.Array[local_78.Count] = (int)lVar16;
          local_78.Count = local_78.Count + 1;
        }
        plVar14 = lines;
        *(undefined4 *)((long)lines->args + lVar18 + -0x2c) = 0;
        iVar15 = numlines;
      }
      dVar21 = (double)CONCAT44(local_68._4_4_,(int)local_68);
      lVar16 = lVar16 + 1;
      lVar18 = lVar18 + 0x98;
    } while (lVar16 < iVar15);
    if (0 < iVar15) {
      uVar17 = 0;
      do {
        uVar10 = plVar20->special;
        local_68 = dVar21;
        pFVar12 = P_GetLineSpecialInfo(uVar10);
        if ((pFVar12 != (FLineSpecial *)0x0) && (uVar19 = (ulong)pFVar12->map_args, uVar19 < 5)) {
          do {
            if (plVar20->args[uVar19] != 0) {
              Printf("Line %d (type %d:%s), arg %u is %d (should be 0)\n",uVar17 & 0xffffffff,
                     (ulong)uVar10,pFVar12->name,uVar19 + 1 & 0xffffffff);
            }
            uVar19 = uVar19 + 1;
          } while (uVar19 != 5);
        }
        uVar8 = uStack_54;
        uVar6 = local_58;
        plVar20->special = 0;
        psVar4 = sides;
        if (uVar10 - 0xde < 3) {
          uVar1 = plVar20->args[1];
          if ((uVar1 & 3) == 0) {
            iVar15 = -1;
            local_84 = 0;
          }
          else {
            iVar15 = (int)((ulong)((long)plVar20->sidedef[0]->sector - (long)sectors) >> 3) *
                     0x7a44c6b;
            local_84 = uVar1 >> 1 & 1;
          }
          if (uVar10 == 0xde || (uVar1 & 4) != 0) {
            dVar21 = (plVar20->delta).X;
            dStack_60 = (plVar20->delta).Y;
          }
          else {
            dVar21 = (double)((int)*(undefined8 *)(plVar20->args + 3) + -0x80);
            dStack_60 = (double)((int)((ulong)*(undefined8 *)(plVar20->args + 3) >> 0x20) + -0x80);
          }
          dVar21 = dVar21 * 0.03125;
          dStack_60 = dStack_60 * 0.03125;
        }
        else {
          dVar21 = 0.0;
          dStack_60 = 0.0;
          iVar15 = -1;
          local_84 = 0;
        }
        local_68._4_4_ = (uint)((ulong)dVar21 >> 0x20);
        local_68._0_4_ = SUB84(dVar21,0);
        local_58 = SUB84(dStack_60,0);
        uVar7 = local_58;
        uStack_54 = (uint)((ulong)dStack_60 >> 0x20);
        local_68 = dVar21;
        switch(uVar10) {
        case 0xdd:
          local_58 = uVar6;
          uStack_54 = uVar8;
          if (plVar20->args[0] == 0) {
            uVar19 = (long)lines[uVar17].sidedef[0] - (long)sides;
            iVar15 = plVar20->args[1];
            local_68._0_4_ = plVar20->args[2];
            iVar11 = plVar20->args[4];
            iVar2 = plVar20->args[3];
            pDVar13 = (DScroller *)
                      M_Malloc_Dbg(0x90,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                                   ,0x1f9);
            DScroller::DScroller
                      (pDVar13,sc_side,(double)(iVar15 - (int)local_68) * 0.015625,
                       (double)(iVar11 - iVar2) * 0.015625,-1,(int)(uVar19 >> 6) * -0x55555555,
                       local_84,scw_all);
            dVar21 = (double)CONCAT44(local_68._4_4_,(int)local_68);
          }
          break;
        case 0xde:
          local_80.searchtag = plVar20->args[0];
          local_80.start = tagManager.IDHashFirst[local_80.searchtag & 0xff];
          uStack_50 = local_58;
          uStack_4c = uStack_54;
          while( true ) {
            uVar10 = FLineIdIterator::Next(&local_80);
            dVar21 = local_68;
            if ((int)uVar10 < 0) break;
            if (uVar17 != uVar10) {
              pDVar13 = (DScroller *)
                        M_Malloc_Dbg(0x90,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                                     ,0x1f9);
              DScroller::DScroller
                        (pDVar13,local_68,(double)CONCAT44(uStack_54,local_58),lines + uVar10,iVar15
                         ,local_84,scw_all);
            }
          }
          break;
        case 0xdf:
          local_80.searchtag = plVar20->args[0];
          if (plVar20->args[2] != 1) {
            if (local_80.searchtag == 0) {
              local_80.start = 0;
            }
            else {
              local_80.start = tagManager.TagHashFirst[local_80.searchtag & 0xff];
            }
            uStack_4c = uStack_54 ^ 0x80000000;
            local_58 = (int)local_68;
            uStack_50 = uVar7;
            local_48 = dStack_60;
            dStack_40 = dStack_60;
            uStack_54 = local_68._4_4_ ^ 0x80000000;
            while( true ) {
              iVar11 = FSectorTagIterator::Next((FSectorTagIterator *)&local_80);
              if (iVar11 < 0) break;
              pDVar13 = (DScroller *)
                        M_Malloc_Dbg(0x90,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                                     ,0x1f9);
              DScroller::DScroller
                        (pDVar13,sc_floor,(double)CONCAT44(uStack_54,local_58),local_48,iVar15,
                         iVar11,local_84,scw_all);
            }
            dVar21 = local_68;
            if (local_78.Count != 0) {
              uVar19 = 0;
              uVar10 = local_78.Count;
              do {
                plVar14 = lines;
                iVar11 = local_78.Array[uVar19];
                if ((lines[iVar11].args[0] == plVar20->args[0]) &&
                   ((lines[iVar11].args[1] & 2) != 0)) {
                  local_68 = dVar21;
                  pDVar13 = (DScroller *)
                            M_Malloc_Dbg(0x90,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                                         ,0x1f9);
                  DScroller::DScroller
                            (pDVar13,sc_floor,(double)CONCAT44(uStack_54,local_58),local_48,iVar15,
                             (int)((ulong)((long)plVar14[iVar11].frontsector - (long)sectors) >> 3)
                             * 0x7a44c6b,local_84,scw_all);
                  uVar10 = local_78.Count;
                  dVar21 = local_68;
                }
                uVar19 = uVar19 + 1;
              } while (uVar19 < uVar10);
            }
            if (plVar20->args[2] < 1) break;
            local_80.searchtag = plVar20->args[0];
          }
          if (local_80.searchtag == 0) {
            local_80.start = 0;
          }
          else {
            local_80.start = tagManager.TagHashFirst[local_80.searchtag & 0xff];
          }
          local_58 = SUB84(dStack_60,0);
          uStack_54 = (uint)((ulong)dStack_60 >> 0x20);
          uStack_50 = local_58;
          uStack_4c = uStack_54;
          local_68 = dVar21;
          while( true ) {
            iVar11 = FSectorTagIterator::Next((FSectorTagIterator *)&local_80);
            if (iVar11 < 0) break;
            pDVar13 = (DScroller *)
                      M_Malloc_Dbg(0x90,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                                   ,0x1f9);
            DScroller::DScroller
                      (pDVar13,sc_carry,local_68,(double)CONCAT44(uStack_54,local_58),iVar15,iVar11,
                       local_84,scw_all);
          }
          dVar21 = local_68;
          if (local_78.Count != 0) {
            uVar19 = 0;
            uVar10 = local_78.Count;
            do {
              plVar14 = lines;
              iVar11 = local_78.Array[uVar19];
              if ((lines[iVar11].args[0] == plVar20->args[0]) && ((lines[iVar11].args[1] & 4) != 0))
              {
                pDVar13 = (DScroller *)
                          M_Malloc_Dbg(0x90,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                                       ,0x1f9);
                DScroller::DScroller
                          (pDVar13,sc_carry,local_68,(double)CONCAT44(uStack_54,local_58),iVar15,
                           (int)((ulong)((long)plVar14[iVar11].frontsector - (long)sectors) >> 3) *
                           0x7a44c6b,local_84,scw_all);
                uVar10 = local_78.Count;
              }
              uVar19 = uVar19 + 1;
              dVar21 = local_68;
            } while (uVar19 < uVar10);
          }
          break;
        case 0xe0:
          local_80.searchtag = plVar20->args[0];
          if (local_80.searchtag == 0) {
            local_80.start = 0;
          }
          else {
            local_80.start = tagManager.TagHashFirst[(byte)local_80.searchtag];
          }
          uVar10 = local_68._4_4_ ^ 0x80000000;
          uStack_4c = uStack_54 ^ 0x80000000;
          local_58 = (int)local_68;
          local_68._0_4_ = uVar7;
          local_68._4_4_ = uStack_54;
          uStack_54 = uVar10;
          uStack_50 = uVar7;
          while( true ) {
            iVar11 = FSectorTagIterator::Next((FSectorTagIterator *)&local_80);
            if (iVar11 < 0) break;
            pDVar13 = (DScroller *)
                      M_Malloc_Dbg(0x90,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                                   ,0x1f9);
            DScroller::DScroller
                      (pDVar13,sc_ceiling,(double)CONCAT44(uStack_54,local_58),
                       (double)CONCAT44(local_68._4_4_,(int)local_68),iVar15,iVar11,local_84,scw_all
                      );
          }
          dVar21 = (double)CONCAT44(local_68._4_4_,(int)local_68);
          if (local_78.Count != 0) {
            uVar19 = 0;
            uVar10 = local_78.Count;
            do {
              plVar14 = lines;
              iVar11 = local_78.Array[uVar19];
              if ((lines[iVar11].args[0] == plVar20->args[0]) && ((lines[iVar11].args[1] & 1) != 0))
              {
                pDVar13 = (DScroller *)
                          M_Malloc_Dbg(0x90,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                                       ,0x1f9);
                DScroller::DScroller
                          (pDVar13,sc_ceiling,(double)CONCAT44(uStack_54,local_58),
                           (double)CONCAT44(local_68._4_4_,(int)local_68),iVar15,
                           (int)((ulong)((long)plVar14[iVar11].frontsector - (long)sectors) >> 3) *
                           0x7a44c6b,local_84,scw_all);
                uVar10 = local_78.Count;
              }
              dVar21 = (double)CONCAT44(local_68._4_4_,(int)local_68);
              uVar19 = uVar19 + 1;
            } while (uVar19 < uVar10);
          }
          break;
        case 0xe1:
          psVar3 = lines[uVar17].sidedef[0];
          local_58 = uVar6;
          uStack_54 = uVar8;
          pDVar13 = (DScroller *)
                    M_Malloc_Dbg(0x90,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                                 ,0x1f9);
          iVar15 = (int)((long)psVar3 - (long)psVar4 >> 6) * -0x55555555;
          EVar5 = plVar20->args[0];
          if (6 < plVar20->args[0] - scw_top) {
            EVar5 = scw_all;
          }
          DScroller::DScroller
                    (pDVar13,sc_side,-sides[iVar15].textures[1].xOffset,
                     sides[iVar15].textures[1].yOffset,-1,iVar15,local_84,EVar5);
          dVar21 = local_68;
          break;
        default:
          switch(uVar10) {
          case 100:
            plVar20->special = 100;
            psVar3 = sides;
            psVar4 = lines[uVar17].sidedef[0];
            local_58 = uVar6;
            uStack_54 = uVar8;
            pDVar13 = (DScroller *)
                      M_Malloc_Dbg(0x90,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                                   ,0x1f9);
            EVar5 = plVar20->args[1];
            if (6 < plVar20->args[1] - scw_top) {
              EVar5 = scw_all;
            }
            DScroller::DScroller
                      (pDVar13,sc_side,(double)plVar20->args[0] * 0.015625,0.0,-1,
                       (int)((ulong)((long)psVar4 - (long)psVar3) >> 6) * -0x55555555,local_84,EVar5
                      );
            dVar21 = local_68;
            break;
          case 0x65:
            plVar20->special = 0x65;
            psVar3 = sides;
            psVar4 = lines[uVar17].sidedef[0];
            local_58 = uVar6;
            uStack_54 = uVar8;
            pDVar13 = (DScroller *)
                      M_Malloc_Dbg(0x90,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                                   ,0x1f9);
            EVar5 = plVar20->args[1];
            if (6 < plVar20->args[1] - scw_top) {
              EVar5 = scw_all;
            }
            DScroller::DScroller
                      (pDVar13,sc_side,(double)-plVar20->args[0] * 0.015625,0.0,-1,
                       (int)((ulong)((long)psVar4 - (long)psVar3) >> 6) * -0x55555555,local_84,EVar5
                      );
            dVar21 = local_68;
            break;
          case 0x66:
            plVar20->special = 0x66;
            psVar3 = sides;
            psVar4 = lines[uVar17].sidedef[0];
            local_58 = uVar6;
            uStack_54 = uVar8;
            pDVar13 = (DScroller *)
                      M_Malloc_Dbg(0x90,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                                   ,0x1f9);
            EVar5 = plVar20->args[1];
            if (6 < plVar20->args[1] - scw_top) {
              EVar5 = scw_all;
            }
            DScroller::DScroller
                      (pDVar13,sc_side,0.0,(double)plVar20->args[0] * 0.015625,-1,
                       (int)((ulong)((long)psVar4 - (long)psVar3) >> 6) * -0x55555555,local_84,EVar5
                      );
            dVar21 = local_68;
            break;
          case 0x67:
            plVar20->special = 0x67;
            psVar3 = sides;
            psVar4 = lines[uVar17].sidedef[0];
            local_58 = uVar6;
            uStack_54 = uVar8;
            pDVar13 = (DScroller *)
                      M_Malloc_Dbg(0x90,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                                   ,0x1f9);
            EVar5 = plVar20->args[1];
            if (6 < plVar20->args[1] - scw_top) {
              EVar5 = scw_all;
            }
            DScroller::DScroller
                      (pDVar13,sc_side,0.0,(double)-plVar20->args[0] * 0.015625,-1,
                       (int)((ulong)((long)psVar4 - (long)psVar3) >> 6) * -0x55555555,local_84,EVar5
                      );
            dVar21 = local_68;
            break;
          default:
            plVar20->special = uVar10;
            local_58 = uVar6;
            uStack_54 = uVar8;
          }
        }
        uVar17 = uVar17 + 1;
        plVar20 = plVar20 + 1;
      } while ((long)uVar17 < (long)numlines);
    }
  }
  local_68 = dVar21;
  TArray<int,_int>::~TArray(&local_78);
  return;
}

Assistant:

void P_SpawnScrollers(void)
{
	int i;
	line_t *l = lines;
	TArray<int> copyscrollers;

	for (i = 0; i < numlines; i++)
	{
		if (lines[i].special == Sector_CopyScroller)
		{
			// don't allow copying the scroller if the sector has the same tag as it would just duplicate it.
			if (!tagManager.SectorHasTag(lines[i].frontsector, lines[i].args[0]))
			{
				copyscrollers.Push(i);
			}
			lines[i].special = 0;
		}
	}

	for (i = 0; i < numlines; i++, l++)
	{
		double dx;	// direction and speed of scrolling
		double dy;
		int control = -1, accel = 0;		// no control sector or acceleration
		int special = l->special;

		// Check for undefined parameters that are non-zero and output messages for them.
		// We don't report for specials we don't understand.
		FLineSpecial *spec = P_GetLineSpecialInfo(special);
		if (spec != NULL)
		{
			int max = spec->map_args;
			for (unsigned arg = max; arg < countof(l->args); ++arg)
			{
				if (l->args[arg] != 0)
				{
					Printf("Line %d (type %d:%s), arg %u is %d (should be 0)\n",
						i, special, spec->name, arg+1, l->args[arg]);
				}
			}
		}

		// killough 3/7/98: Types 245-249 are same as 250-254 except that the
		// first side's sector's heights cause scrolling when they change, and
		// this linedef controls the direction and speed of the scrolling. The
		// most complicated linedef since donuts, but powerful :)
		//
		// killough 3/15/98: Add acceleration. Types 214-218 are the same but
		// are accelerative.

		// [RH] Assume that it's a scroller and zero the line's special.
		l->special = 0;

		dx = dy = 0;	// Shut up, GCC

		if (special == Scroll_Ceiling ||
			special == Scroll_Floor ||
			special == Scroll_Texture_Model)
		{
			if (l->args[1] & 3)
			{
				// if 1, then displacement
				// if 2, then accelerative (also if 3)
				control = int(l->sidedef[0]->sector - sectors);
				if (l->args[1] & 2)
					accel = 1;
			}
			if (special == Scroll_Texture_Model ||
				l->args[1] & 4)
			{
				// The line housing the special controls the
				// direction and speed of scrolling.
				dx = l->Delta().X / 32.;
				dy = l->Delta().Y / 32.;
			}
			else
			{
				// The speed and direction are parameters to the special.
				dx = (l->args[3] - 128) / 32.;
				dy = (l->args[4] - 128) / 32.;
			}
		}

		switch (special)
		{
			int s;

		case Scroll_Ceiling:
		{
			FSectorTagIterator itr(l->args[0]);
			while ((s = itr.Next()) >= 0)
			{
				new DScroller(EScroll::sc_ceiling, -dx, dy, control, s, accel);
			}
			for (unsigned j = 0; j < copyscrollers.Size(); j++)
			{
				line_t *line = &lines[copyscrollers[j]];

				if (line->args[0] == l->args[0] && (line->args[1] & 1))
				{
					new DScroller(EScroll::sc_ceiling, -dx, dy, control, int(line->frontsector - sectors), accel);
				}
			}
			break;
		}

		case Scroll_Floor:
			if (l->args[2] != 1)
			{ // scroll the floor texture
				FSectorTagIterator itr(l->args[0]);
				while ((s = itr.Next()) >= 0)
				{
					new DScroller (EScroll::sc_floor, -dx, dy, control, s, accel);
				}
				for(unsigned j = 0;j < copyscrollers.Size(); j++)
				{
					line_t *line = &lines[copyscrollers[j]];

					if (line->args[0] == l->args[0] && (line->args[1] & 2))
					{
						new DScroller (EScroll::sc_floor, -dx, dy, control, int(line->frontsector-sectors), accel);
					}
				}
			}

			if (l->args[2] > 0)
			{ // carry objects on the floor
				FSectorTagIterator itr(l->args[0]);
				while ((s = itr.Next()) >= 0)
				{
					new DScroller (EScroll::sc_carry, dx, dy, control, s, accel);
				}
				for(unsigned j = 0;j < copyscrollers.Size(); j++)
				{
					line_t *line = &lines[copyscrollers[j]];

					if (line->args[0] == l->args[0] && (line->args[1] & 4))
					{
						new DScroller (EScroll::sc_carry, dx, dy, control, int(line->frontsector-sectors), accel);
					}
				}
			}
			break;

		// killough 3/1/98: scroll wall according to linedef
		// (same direction and speed as scrolling floors)
		case Scroll_Texture_Model:
		{
			FLineIdIterator itr(l->args[0]);
			while ((s = itr.Next()) >= 0)
			{
				if (s != i)
					new DScroller(dx, dy, lines + s, control, accel);
			}
			break;
		}

		case Scroll_Texture_Offsets:
			// killough 3/2/98: scroll according to sidedef offsets
			s = int(lines[i].sidedef[0] - sides);
			new DScroller (EScroll::sc_side, -sides[s].GetTextureXOffset(side_t::mid),
				sides[s].GetTextureYOffset(side_t::mid), -1, s, accel, SCROLLTYPE(l->args[0]));
			break;

		case Scroll_Texture_Left:
			l->special = special;	// Restore the special, for compat_useblocking's benefit.
			s = int(lines[i].sidedef[0] - sides);
			new DScroller (EScroll::sc_side, l->args[0] / 64., 0,
						   -1, s, accel, SCROLLTYPE(l->args[1]));
			break;

		case Scroll_Texture_Right:
			l->special = special;
			s = int(lines[i].sidedef[0] - sides);
			new DScroller (EScroll::sc_side, -l->args[0] / 64., 0,
						   -1, s, accel, SCROLLTYPE(l->args[1]));
			break;

		case Scroll_Texture_Up:
			l->special = special;
			s = int(lines[i].sidedef[0] - sides);
			new DScroller (EScroll::sc_side, 0, l->args[0] / 64.,
						   -1, s, accel, SCROLLTYPE(l->args[1]));
			break;

		case Scroll_Texture_Down:
			l->special = special;
			s = int(lines[i].sidedef[0] - sides);
			new DScroller (EScroll::sc_side, 0, -l->args[0] / 64.,
						   -1, s, accel, SCROLLTYPE(l->args[1]));
			break;

		case Scroll_Texture_Both:
			s = int(lines[i].sidedef[0] - sides);
			if (l->args[0] == 0) {
				dx = (l->args[1] - l->args[2]) / 64.;
				dy = (l->args[4] - l->args[3]) / 64.;
				new DScroller (EScroll::sc_side, dx, dy, -1, s, accel);
			}
			break;

		default:
			// [RH] It wasn't a scroller after all, so restore the special.
			l->special = special;
			break;
		}
	}
}